

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtrule.cpp
# Opt level: O1

DateTimeRule * __thiscall icu_63::DateTimeRule::operator=(DateTimeRule *this,DateTimeRule *right)

{
  if (this != right) {
    this->fMonth = right->fMonth;
    this->fDayOfMonth = right->fDayOfMonth;
    this->fDayOfWeek = right->fDayOfWeek;
    this->fWeekInMonth = right->fWeekInMonth;
    this->fMillisInDay = right->fMillisInDay;
    this->fDateRuleType = right->fDateRuleType;
    this->fTimeRuleType = right->fTimeRuleType;
  }
  return this;
}

Assistant:

DateTimeRule&
DateTimeRule::operator=(const DateTimeRule& right) {
    if (this != &right) {
        fMonth = right.fMonth;
        fDayOfMonth = right.fDayOfMonth;
        fDayOfWeek = right.fDayOfWeek;
        fWeekInMonth = right.fWeekInMonth;
        fMillisInDay = right.fMillisInDay;
        fDateRuleType = right.fDateRuleType;
        fTimeRuleType = right.fTimeRuleType;
    }
    return *this;
}